

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

size_t qHash(QMakeBaseKey *key)

{
  ulong uVar1;
  ulong uVar2;
  QStringView QVar3;
  QStringView QVar4;
  
  QVar3.m_data = (key->root).d.ptr;
  QVar3.m_size = (key->root).d.size;
  uVar1 = qHash(QVar3,0);
  QVar4.m_data = (key->stash).d.ptr;
  QVar4.m_size = (key->stash).d.size;
  uVar2 = qHash(QVar4,0);
  return uVar2 ^ uVar1 ^ (ulong)key->hostBuild;
}

Assistant:

size_t qHash(const QMakeBaseKey &key)
{
    return qHash(key.root) ^ qHash(key.stash) ^ (uint)key.hostBuild;
}